

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int iStart;
  int iVar1;
  ExprList *pList;
  Vdbe *p;
  int p2;
  int iVar2;
  int iVar3;
  int iVar4;
  KeyInfo *pKVar5;
  int target;
  int p1;
  int iVar6;
  int p1_00;
  int iVar7;
  int nBase;
  char cVar8;
  uint uVar9;
  Op *pOVar10;
  Op *pOVar11;
  uint uVar12;
  
  uVar9 = pSort->sortFlags & 1;
  uVar12 = uVar9 ^ 1;
  pList = pSort->pOrderBy;
  iVar4 = pList->nExpr;
  nBase = uVar12 + nData + iVar4;
  iStart = pSort->nOBSat;
  if (nPrefixReg == 0) {
    target = pParse->nMem + 1;
    pParse->nMem = pParse->nMem + nBase;
  }
  else {
    target = regData - nPrefixReg;
  }
  if (pSelect->iOffset == 0) {
    p1 = pSelect->iLimit;
  }
  else {
    p1 = pSelect->iOffset + 1;
  }
  p = pParse->pVdbe;
  iVar6 = pParse->nLabel + -1;
  pParse->nLabel = iVar6;
  pSort->labelDone = iVar6;
  sqlite3ExprCodeExprList(pParse,pList,target,regOrigData,(regOrigData != 0) * '\x04' + '\x01');
  cVar8 = (char)uVar9;
  if (cVar8 == '\0') {
    sqlite3VdbeAddOp3(p,0x78,pSort->iECursor,iVar4 + target,0);
  }
  if (0 < nData && nPrefixReg == 0) {
    sqlite3VdbeAddOp3(pParse->pVdbe,0x4d,regData,uVar12 + iVar4 + target,nData);
  }
  iVar6 = 0;
  p2 = 0;
  if (0 < iStart) {
    p2 = makeSorterRecord(pParse,pSort,pSelect,target,nBase);
    iVar1 = pSort->nOBSat;
    iVar7 = pParse->nMem + 1;
    pParse->nMem = iVar1 + pParse->nMem;
    if (cVar8 == '\0') {
      iVar3 = target + iVar4;
      iVar2 = 0x14;
    }
    else {
      iVar3 = pSort->iECursor;
      iVar2 = 0x73;
    }
    iVar2 = sqlite3VdbeAddOp3(p,iVar2,iVar3,0,0);
    sqlite3VdbeAddOp3(p,0x57,iVar7,target,pSort->nOBSat);
    iVar3 = pSort->addrSortIndex;
    if (iVar3 < 0) {
      iVar3 = p->nOp + -1;
    }
    if (p->db->mallocFailed == '\0') {
      pOVar10 = p->aOp + iVar3;
    }
    else {
      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pParse->db->mallocFailed != '\0') {
      return;
    }
    pOVar10->p2 = nBase - iVar1;
    pKVar5 = (pOVar10->p4).pKeyInfo;
    memset(pKVar5->aSortOrder,0,(ulong)pKVar5->nKeyField);
    sqlite3VdbeChangeP4(p,-1,(char *)pKVar5,-9);
    pKVar5 = sqlite3KeyInfoFromExprList
                       (pParse,pSort->pOrderBy,iStart,
                        ~(uint)pKVar5->nKeyField + (uint)pKVar5->nAllField);
    (pOVar10->p4).pKeyInfo = pKVar5;
    iVar1 = p->nOp;
    sqlite3VdbeAddOp3(p,0x10,iVar1 + 1,0,iVar1 + 1);
    iVar3 = pParse->nLabel + -1;
    pParse->nLabel = iVar3;
    pSort->labelBkOut = iVar3;
    p1_00 = pParse->nMem + 1;
    pParse->nMem = p1_00;
    pSort->regReturn = p1_00;
    sqlite3VdbeAddOp3(p,0xc,p1_00,iVar3,0);
    sqlite3VdbeAddOp3(p,0x8a,pSort->iECursor,0,0);
    if (p1 != 0) {
      sqlite3VdbeAddOp3(p,0x14,p1,pSort->labelDone,0);
    }
    pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
    pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (p->db->mallocFailed == '\0') {
      iVar3 = p->nOp + -1;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      pOVar10 = p->aOp + iVar3;
    }
    pOVar10->p2 = p->nOp;
    sqlite3VdbeAddOp3(pParse->pVdbe,0x4d,target,iVar7,pSort->nOBSat);
    if (p->db->mallocFailed == '\0') {
      iVar7 = p->nOp + -1;
      if (-1 < iVar1) {
        iVar7 = iVar1;
      }
      pOVar11 = p->aOp + iVar7;
    }
    pOVar11->p2 = p->nOp;
  }
  if (p1 != 0) {
    iVar1 = pSort->iECursor;
    sqlite3VdbeAddOp3(p,0x30,p1,p->nOp + 4,0);
    sqlite3VdbeAddOp3(p,0x20,iVar1,0,0);
    iVar6 = sqlite3VdbeAddOp3(p,0x25,iVar1,0,iStart + target);
    if (p->db->mallocFailed == '\0') {
      pOVar10 = p->aOp;
      pOVar10[iVar6].p4type = -3;
      pOVar10[iVar6].p4.i = iVar4 - iStart;
    }
    sqlite3VdbeAddOp3(p,0x7b,iVar1,0,0);
  }
  if (p2 == 0) {
    p2 = makeSorterRecord(pParse,pSort,pSelect,target,nBase);
  }
  iVar4 = sqlite3VdbeAddOp3(p,0x84 - (pSort->sortFlags & 1),pSort->iECursor,p2,target + iStart);
  if (p->db->mallocFailed == '\0') {
    pOVar10 = p->aOp;
    pOVar10[iVar4].p4type = -3;
    pOVar10[iVar4].p4.i = nBase - iStart;
  }
  if (iVar6 != 0) {
    iVar4 = pSort->labelOBLopt;
    if (iVar4 == 0) {
      iVar4 = p->nOp;
    }
    if (iVar6 < 0) {
      iVar6 = p->nOp + -1;
    }
    if (p->db->mallocFailed == '\0') {
      pOVar10 = p->aOp + iVar6;
    }
    else {
      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar10->p2 = iVar4;
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the regData data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = 0;                               /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */
  int iSkip = 0;                     /* End of the sorter insert loop */

  assert( bSeq==0 || bSeq==1 );

  /* Three cases:
  **   (1) The data to be sorted has already been packed into a Record
  **       by a prior OP_MakeRecord.  In this case nData==1 and regData
  **       will be completely unrelated to regOrigData.
  **   (2) All output columns are included in the sort record.  In that
  **       case regData==regOrigData.
  **   (3) Some output columns are omitted from the sort record due to
  **       the SQLITE_ENABLE_SORTER_REFERENCE optimization, or due to the
  **       SQLITE_ECEL_OMITREF optimization, or due to the 
  **       SortCtx.pDeferredRowLoad optimiation.  In any of these cases
  **       regOrigData is 0 to prevent this routine from trying to copy
  **       values that might not yet exist.
  */
  assert( nData==1 || regData==regOrigData || regOrigData==0 );

  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nPrefixReg;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(pParse);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr); 
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortOrder, 0, pKI->nKeyField); /* Makes OP_Jump testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nAllField > pKI->nKeyField+2 );
    pOp->p4.pKeyInfo = sqlite3KeyInfoFromExprList(pParse,pSort->pOrderBy,nOBSat,
                                           pKI->nAllField-pKI->nKeyField-1);
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(pParse);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( iLimit ){
    /* At this point the values for the new sorter entry are stored
    ** in an array of registers. They need to be composed into a record
    ** and inserted into the sorter if either (a) there are currently
    ** less than LIMIT+OFFSET items or (b) the new record is smaller than 
    ** the largest record currently in the sorter. If (b) is true and there
    ** are already LIMIT+OFFSET items in the sorter, delete the largest
    ** entry before inserting the new one. This way there are never more 
    ** than LIMIT+OFFSET items in the sorter.
    **
    ** If the new record does not need to be inserted into the sorter,
    ** jump to the next iteration of the loop. If the pSort->labelOBLopt
    ** value is not zero, then it is a label of where to jump.  Otherwise,
    ** just bypass the row insert logic.  See the header comment on the
    ** sqlite3WhereOrderByLimitOptLabel() function for additional info.
    */
    int iCsr = pSort->iECursor;
    sqlite3VdbeAddOp2(v, OP_IfNotZero, iLimit, sqlite3VdbeCurrentAddr(v)+4);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Last, iCsr, 0);
    iSkip = sqlite3VdbeAddOp4Int(v, OP_IdxLE,
                                 iCsr, 0, regBase+nOBSat, nExpr-nOBSat);
    VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Delete, iCsr);
  }
  if( regRecord==0 ){
    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iSkip ){
    sqlite3VdbeChangeP2(v, iSkip,
         pSort->labelOBLopt ? pSort->labelOBLopt : sqlite3VdbeCurrentAddr(v));
  }
}